

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSim.c
# Opt level: O3

uint Dch_NodeHash(void *p,Aig_Obj_t *pObj)

{
  uint uVar1;
  long *plVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  if (1 < (int)*(uint *)((long)p + 4)) {
    uVar1 = pObj->Id;
    if ((-1 < (long)(int)uVar1) && (uVar1 < *(uint *)((long)p + 4))) {
      plVar2 = *(long **)((long)p + 8);
      uVar4 = (uint)((ulong)(plVar2[1] - *plVar2) >> 2);
      if ((pObj->field_0x18 & 8) == 0) {
        if (0 < (int)uVar4) {
          uVar5 = 0;
          uVar3 = 0;
          do {
            uVar3 = uVar3 ^ Dch_NodeHash::s_FPrimes[(uint)uVar5 & 0x7f] *
                            *(int *)(plVar2[(int)uVar1] + uVar5 * 4);
            uVar5 = uVar5 + 1;
          } while ((uVar4 & 0x7fffffff) != uVar5);
          return uVar3;
        }
      }
      else if (0 < (int)uVar4) {
        uVar5 = 0;
        uVar3 = 0;
        do {
          uVar3 = uVar3 ^ ~*(uint *)(plVar2[(int)uVar1] + uVar5 * 4) *
                          Dch_NodeHash::s_FPrimes[(uint)uVar5 & 0x7f];
          uVar5 = uVar5 + 1;
        } while ((uVar4 & 0x7fffffff) != uVar5);
        return uVar3;
      }
      return 0;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

unsigned Dch_NodeHash( void * p, Aig_Obj_t * pObj )
{
    Vec_Ptr_t * vSims = (Vec_Ptr_t *)p;
    static int s_FPrimes[128] = { 
        1009, 1049, 1093, 1151, 1201, 1249, 1297, 1361, 1427, 1459, 
        1499, 1559, 1607, 1657, 1709, 1759, 1823, 1877, 1933, 1997, 
        2039, 2089, 2141, 2213, 2269, 2311, 2371, 2411, 2467, 2543, 
        2609, 2663, 2699, 2741, 2797, 2851, 2909, 2969, 3037, 3089, 
        3169, 3221, 3299, 3331, 3389, 3461, 3517, 3557, 3613, 3671, 
        3719, 3779, 3847, 3907, 3943, 4013, 4073, 4129, 4201, 4243, 
        4289, 4363, 4441, 4493, 4549, 4621, 4663, 4729, 4793, 4871, 
        4933, 4973, 5021, 5087, 5153, 5227, 5281, 5351, 5417, 5471, 
        5519, 5573, 5651, 5693, 5749, 5821, 5861, 5923, 6011, 6073, 
        6131, 6199, 6257, 6301, 6353, 6397, 6481, 6563, 6619, 6689, 
        6737, 6803, 6863, 6917, 6977, 7027, 7109, 7187, 7237, 7309, 
        7393, 7477, 7523, 7561, 7607, 7681, 7727, 7817, 7877, 7933, 
        8011, 8039, 8059, 8081, 8093, 8111, 8123, 8147
    };
    unsigned * pSim;
    unsigned uHash;
    int k, nWords;
    nWords = (unsigned *)Vec_PtrEntry(vSims, 1) - (unsigned *)Vec_PtrEntry(vSims, 0);
    uHash = 0;
    pSim  = Dch_ObjSim( vSims, pObj );
    if ( pObj->fPhase )
    {
        for ( k = 0; k < nWords; k++ )
            uHash ^= ~pSim[k] * s_FPrimes[k & 0x7F];
    }
    else
    {
        for ( k = 0; k < nWords; k++ )
            uHash ^= pSim[k] * s_FPrimes[k & 0x7F];
    }
    return uHash;
}